

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O2

void __thiscall rsg::VariableType::Member::~Member(Member *this)

{
  VariableType *this_00;
  
  this_00 = this->m_type;
  if (this_00 != (VariableType *)0x0) {
    ~VariableType(this_00);
  }
  operator_delete(this_00,0x50);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

~Member (void)
		{
			delete m_type;
		}